

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_dump.cc
# Opt level: O2

void print_buf(fdb_kvs_handle *db,void *buf,size_t buflen,bool hex,int align)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  if (buf == (void *)0x0) {
    puts("(null)");
    return;
  }
  if (hex) {
    puts("(hex)");
    uVar5 = 0;
    while (uVar5 < buflen) {
      printf("        ");
      uVar1 = uVar5 + (long)align;
      uVar3 = uVar5;
      while (uVar3 < uVar1) {
        if (uVar3 < buflen) {
          printf("%02x ",(ulong)*(byte *)((long)buf + uVar3));
        }
        else {
          printf("   ");
        }
        uVar3 = uVar3 + 1;
        if ((uVar3 & 7) == 0) {
          putchar(0x20);
        }
      }
      putchar(0x20);
      sVar4 = buflen;
      if (uVar1 < buflen) {
        sVar4 = uVar1;
      }
      for (; uVar5 < sVar4; uVar5 = uVar5 + 1) {
        bVar2 = *(byte *)((long)buf + uVar5);
        if (0x5d < (byte)(bVar2 - 0x20)) {
          bVar2 = 0x2e;
        }
        putchar((uint)bVar2);
      }
      putchar(10);
      uVar5 = uVar1;
    }
    return;
  }
  printf("%.*s\n",buflen & 0xffffffff,buf);
  return;
}

Assistant:

INLINE void print_buf(fdb_kvs_handle *db, void *buf, size_t buflen, bool hex,
                      int align)
{
    if (buf) {
        if (!hex) {
            // plaintext
            printf("%.*s\n", (int)buflen, (char*)buf);
        } else {
            // hex dump
            size_t i, j;
            printf("(hex)\n");
            for (i=0;i<buflen;i+=align) {
                printf("        ");
                for (j=i; j<i+align; ++j){
                    if (j<buflen) {
                        printf("%02x ", ((uint8_t*)buf)[j]);
                    } else {
                        printf("   ");
                    }
                    if ((j+1)%8 == 0) {
                        printf(" ");
                    }
                }
                printf(" ");
                for (j=i; j<i+align && j<buflen; ++j){
                    // print only readable ascii character
                    printf("%c",
                     (0x20 <= ((char*)buf)[j] && ((char*)buf)[j] <= 0x7d)?
                               ((char*)buf)[j] : '.'  );
                }
                printf("\n");
            }
        }
    } else {
        printf("(null)\n");
    }
}